

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

previous_contract *
cppwinrt::decode_previous_contract_attribute
          (previous_contract *__return_storage_ptr__,CustomAttribute *attribute)

{
  char *pcVar1;
  uint uVar2;
  variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
  *pvVar3;
  variant_alternative_t<12UL,_variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_basic_string_view<char,_char_traits<char>_>,_SystemType,_EnumValue>_>
  *pvVar4;
  CustomAttributeSig signature;
  CustomAttributeSig local_40;
  
  winmd::reader::CustomAttribute::Value(&local_40,attribute);
  if (2 < (ulong)(((long)local_40.m_fixed_args.
                         super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_40.m_fixed_args.
                         super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)) {
    (__return_storage_ptr__->contract_to)._M_len = 0;
    (__return_storage_ptr__->contract_to)._M_str = (char *)0x0;
    (__return_storage_ptr__->contract_from)._M_len = 0;
    (__return_storage_ptr__->contract_from)._M_str = (char *)0x0;
    __return_storage_ptr__->version_low = 0;
    __return_storage_ptr__->version_high = 0;
    pvVar3 = &std::
              get<0ul,winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                        (&(local_40.m_fixed_args.
                           super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                           ._M_impl.super__Vector_impl_data._M_start)->value)->value;
    pvVar4 = std::
             get<12ul,bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                       (pvVar3);
    pcVar1 = pvVar4->_M_str;
    (__return_storage_ptr__->contract_from)._M_len = pvVar4->_M_len;
    (__return_storage_ptr__->contract_from)._M_str = pcVar1;
    uVar2 = get_integer_attribute<unsigned_int>
                      ((FixedArgSig *)
                       &local_40.m_fixed_args.
                        super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].value);
    __return_storage_ptr__->version_low = uVar2;
    uVar2 = get_integer_attribute<unsigned_int>
                      ((FixedArgSig *)
                       &local_40.m_fixed_args.
                        super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].value);
    __return_storage_ptr__->version_high = uVar2;
    if ((long)local_40.m_fixed_args.
              super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_40.m_fixed_args.
              super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
              ._M_impl.super__Vector_impl_data._M_start == 0xe0) {
      pvVar3 = &std::
                get<0ul,winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                          (&local_40.m_fixed_args.
                            super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                            ._M_impl.super__Vector_impl_data._M_start[3].value)->value;
      pvVar4 = std::
               get<12ul,bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                         (pvVar3);
      pcVar1 = pvVar4->_M_str;
      (__return_storage_ptr__->contract_to)._M_len = pvVar4->_M_len;
      (__return_storage_ptr__->contract_to)._M_str = pcVar1;
    }
    std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::~vector
              (&local_40.m_named_args);
    std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::~vector
              (&local_40.m_fixed_args);
    return __return_storage_ptr__;
  }
  __assert_fail("args.size() >= 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/helpers.h"
                ,0x183,
                "previous_contract cppwinrt::decode_previous_contract_attribute(const CustomAttribute &)"
               );
}

Assistant:

static previous_contract decode_previous_contract_attribute(CustomAttribute const& attribute)
    {
        // PreviousContractVersionAttribute has two constructors:
        //      .ctor(string fromContract, uint32 versionLow, uint32 versionHigh)
        //      .ctor(string fromContract, uint32 versionLow, uint32 versionHigh, string contractTo)
        auto signature = attribute.Value();
        auto& args = signature.FixedArgs();
        assert(args.size() >= 3);

        previous_contract result{};
        result.contract_from = get_attribute_value<std::string_view>(args[0]);
        result.version_low = get_integer_attribute<uint32_t>(args[1]);
        result.version_high = get_integer_attribute<uint32_t>(args[2]);
        if (args.size() == 4)
        {
            result.contract_to = get_attribute_value<std::string_view>(args[3]);
        }

        return result;
    }